

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char> __thiscall
fmt::v7::detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
          (default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *this,handle handle)

{
  parse_context local_48;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> local_28;
  
  local_48.format_str_.data_ = (char *)0x0;
  local_48.format_str_.size_ = 0;
  local_48.next_arg_id_ = 0;
  local_28.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  local_28.args_.desc_ = (this->args).desc_;
  local_28.args_.field_1._0_4_ = *(undefined4 *)&(this->args).field_1;
  local_28.args_.field_1._4_4_ = *(undefined4 *)((long)&(this->args).field_1 + 4);
  local_28.loc_.locale_._0_4_ = *(undefined4 *)&(this->loc).locale_;
  local_28.loc_.locale_._4_4_ = *(undefined4 *)((long)&(this->loc).locale_ + 4);
  (*handle.custom_.format)(handle.custom_.value,&local_48,&local_28);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         local_28.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt operator()(typename basic_format_arg<context>::handle handle) {
    basic_format_parse_context<Char> parse_ctx({});
    basic_format_context<OutputIt, Char> format_ctx(out, args, loc);
    handle.format(parse_ctx, format_ctx);
    return format_ctx.out();
  }